

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int *__s;
  double *__s_00;
  float *__s_01;
  ostream *poVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int N;
  uint local_84;
  Vector<int> local_80;
  Vector<float> local_70;
  Vector<double> local_60;
  Vector<int> local_50;
  Vector<int> local_40;
  
  local_84 = 0;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_84);
  uVar3 = local_84;
  lVar10 = (long)(int)local_84;
  uVar7 = (ulong)local_84;
  sVar1 = uVar7 * 4;
  local_40.N = local_84;
  sVar6 = sVar1;
  if (lVar10 < 0) {
    sVar6 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(sVar6);
  local_40.values = __s;
  if (0 < lVar10) {
    lVar9 = 0;
    memset(__s,0,sVar1);
    auVar2 = _DAT_00102030;
    lVar5 = uVar7 - 1;
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11 = auVar11 ^ _DAT_00102030;
    auVar18 = _DAT_00102010;
    auVar16 = _DAT_00102020;
    do {
      auVar19 = auVar16 ^ auVar2;
      iVar14 = auVar11._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar14 && auVar11._0_4_ < auVar19._0_4_ ||
                  iVar14 < auVar19._4_4_) & 1)) {
        *(undefined4 *)((long)__s + lVar9) = 3;
      }
      if ((auVar19._12_4_ != auVar11._12_4_ || auVar19._8_4_ <= auVar11._8_4_) &&
          auVar19._12_4_ <= auVar11._12_4_) {
        *(undefined4 *)((long)__s + lVar9 + 4) = 3;
      }
      auVar19 = auVar18 ^ auVar2;
      iVar20 = auVar19._4_4_;
      if (iVar20 <= iVar14 && (iVar20 != iVar14 || auVar19._0_4_ <= auVar11._0_4_)) {
        *(undefined4 *)((long)__s + lVar9 + 8) = 3;
        *(undefined4 *)((long)__s + lVar9 + 0xc) = 3;
      }
      lVar5 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar5 + 4;
      lVar5 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar5 + 4;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar9);
  }
  uVar7 = lVar10 << 2;
  local_50.N = uVar3;
  if ((int)uVar3 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_50.values = (int *)operator_new__(uVar7);
  if (0 < (int)uVar3) {
    memcpy(local_50.values,__s,sVar1);
  }
  Vector<int>::print(&local_50);
  uVar3 = local_84;
  uVar8 = (ulong)local_84;
  local_80.N = local_84;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)local_84) {
    uVar7 = uVar8 << 2;
  }
  local_80.values = (int *)operator_new__(uVar7);
  if (0 < (int)uVar3) {
    memset(local_80.values,0,uVar8 << 2);
  }
  print<int>(&local_80);
  Vector<int>::operator=(&local_80,&local_40);
  print<int>(&local_80);
  uVar3 = local_84;
  uVar8 = (ulong)local_84;
  local_60.N = local_84;
  sVar1 = uVar8 * 8;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)local_84) {
    uVar7 = sVar1;
  }
  __s_00 = (double *)operator_new__(uVar7);
  local_60.values = __s_00;
  if (0 < (int)uVar3) {
    lVar5 = 0;
    memset(__s_00,0,sVar1);
    auVar2 = _DAT_00102030;
    lVar10 = uVar8 - 1;
    auVar12._8_4_ = (int)lVar10;
    auVar12._0_8_ = lVar10;
    auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar12 = auVar12 ^ _DAT_00102030;
    auVar19 = _DAT_00102020;
    do {
      auVar18 = auVar19 ^ auVar2;
      if ((bool)(~(auVar18._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar18._0_4_ ||
                  auVar12._4_4_ < auVar18._4_4_) & 1)) {
        *(undefined8 *)((long)__s_00 + lVar5) = 0x40091eb851eb851f;
      }
      if ((auVar18._12_4_ != auVar12._12_4_ || auVar18._8_4_ <= auVar12._8_4_) &&
          auVar18._12_4_ <= auVar12._12_4_) {
        *(undefined8 *)((long)__s_00 + lVar5 + 8) = 0x40091eb851eb851f;
      }
      lVar10 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar10 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar5);
  }
  print<double>(&local_60);
  uVar3 = local_84;
  uVar8 = (ulong)local_84;
  local_70.N = local_84;
  sVar1 = uVar8 * 4;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)local_84) {
    uVar7 = sVar1;
  }
  __s_01 = (float *)operator_new__(uVar7);
  local_70.values = __s_01;
  if (0 < (int)uVar3) {
    lVar5 = 0;
    memset(__s_01,0,sVar1);
    auVar2 = _DAT_00102030;
    lVar10 = uVar8 - 1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar13 = auVar13 ^ _DAT_00102030;
    auVar15 = _DAT_00102010;
    auVar17 = _DAT_00102020;
    do {
      auVar18 = auVar17 ^ auVar2;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar14 && auVar13._0_4_ < auVar18._0_4_ ||
                  iVar14 < auVar18._4_4_) & 1)) {
        *(undefined4 *)((long)__s_01 + lVar5) = 0x4048f5c3;
      }
      if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
          auVar18._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)__s_01 + lVar5 + 4) = 0x4048f5c3;
      }
      auVar18 = auVar15 ^ auVar2;
      iVar20 = auVar18._4_4_;
      if (iVar20 <= iVar14 && (iVar20 != iVar14 || auVar18._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)__s_01 + lVar5 + 8) = 0x4048f5c3;
        *(undefined4 *)((long)__s_01 + lVar5 + 0xc) = 0x4048f5c3;
      }
      lVar10 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar10 + 4;
      lVar10 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar10 + 4;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar3 + 3 >> 2) << 4 != lVar5);
  }
  print<float>(&local_70);
  poVar4 = std::ostream::_M_insert<double>((double)*local_70.values);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_70.values != (float *)0x0) {
    operator_delete__(local_70.values);
  }
  if (local_60.values != (double *)0x0) {
    operator_delete__(local_60.values);
  }
  if (local_80.values != (int *)0x0) {
    operator_delete__(local_80.values);
  }
  if (local_50.values != (int *)0x0) {
    operator_delete__(local_50.values);
  }
  if (local_40.values != (int *)0x0) {
    operator_delete__(local_40.values);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // There is a std::cin object meaning console input. Use it for reading an integer from console.
    //   { int N; std::cin >> N; } defines an integer, reads an integer from the keyboard and
    //   stores it in variable "N".
    auto N = 0;
    std::cin >> N;

    // Create an "N" dimensional vector by "IntVector v1(N)" or equivalently "auto v1 = IntVector(N)".
    // If, for instance, N is entered as 5, this creates an IntVector instance that can store 5 different integer values
    //   (use new operator for dynamic memory allocation).
    auto v1 = Vector<int>(N);

    // Use v1.set(...) method for N times via a for loop to
    //   initialize the IntVector instance's contents to 1, 2, ..., N respectively.
    for(int i=0; i<N; ++i)
        v1.set(i, 3.14);

    // Use copy-constructor by "auto v2 = IntVector(v1);"
    auto v2 = Vector<int>(v1);

    // Write v2's contents by "v2.print();" (The output shall be 1, 2, 3, ..., N)
    //   where N is the number entered from the keyboard at program's start.
    v2.print();

    // Create v3 by "auto v3 = IntVector(N);". Print it "v3.print();". Result is "0, 0, ..., 0"
    auto v3 = Vector<int>(N);
    print(v3);

    //"v3 = v1; v3.print();" Result shall be 1, 2, 3, ..., N if you did everything correctly.
    v3 = v1;
    print(v3);

    auto v4 = Vector<double>(N);
    for(int i=0; i<N; ++i)
        v4.set(i, 3.14);
    print(v4);

    auto v5 = Vector<float>(N);
    for(int i=0; i<N; ++i)
        v5.set(i, 3.14f);
    print(v5);

    std::cout << v5[0] << std::endl;

    return 0;
}